

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

void testing::internal::WriteToShardStatusFileIfNeeded(void)

{
  char *__filename;
  FILE *__stream;
  
  __filename = getenv("GTEST_SHARD_STATUS_FILE");
  if (__filename == (char *)0x0) {
    return;
  }
  __stream = fopen(__filename,"w");
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
    return;
  }
  ColoredPrintf(COLOR_RED,
                "Could not write to the test shard status file \"%s\" specified by the %s environment variable.\n"
                ,__filename,"GTEST_SHARD_STATUS_FILE");
  fflush(_stdout);
  exit(1);
}

Assistant:

void WriteToShardStatusFileIfNeeded() {
			const char* const test_shard_file = posix::GetEnv(kTestShardStatusFile);
			if (test_shard_file != NULL) {
				FILE* const file = posix::FOpen(test_shard_file, "w");
				if (file == NULL) {
					ColoredPrintf(COLOR_RED,
						"Could not write to the test shard status file \"%s\" "
						"specified by the %s environment variable.\n",
						test_shard_file, kTestShardStatusFile);
					fflush(stdout);
					exit(EXIT_FAILURE);
				}
				fclose(file);
			}
		}